

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  int max;
  int iVar1;
  void *pvVar2;
  bool bVar3;
  int newSize;
  xmlChar *tmp;
  int local_40;
  int maxLength;
  int l;
  int cur;
  int rl;
  int r;
  int ql;
  int q;
  size_t size_local;
  size_t len_local;
  xmlChar *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  max = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    max = 1000000000;
  }
  _ql = size;
  size_local = len;
  len_local = (size_t)buf;
  buf_local = (xmlChar *)ctxt;
  if (buf == (xmlChar *)0x0) {
    size_local = 0;
    _ql = 100;
    len_local = (size_t)(*xmlMalloc)(100);
    if ((void *)len_local == (void *)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)buf_local);
      return;
    }
  }
  r = xmlCurrentCharRecover((xmlParserCtxtPtr)buf_local,&rl);
  if (r == 0) {
LAB_001413a5:
    xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                      "Comment not terminated\n",(xmlChar *)0x0);
    (*xmlFree)((void *)len_local);
  }
  else {
    if (r < 0x100) {
      if (((8 < r) && (r < 0xb)) || ((r == 0xd || (0x1f < r)))) {
LAB_00140ecb:
        if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
          *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
               *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
          *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
        }
        else {
          *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
               *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
        }
        *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
             *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)rl;
        cur = xmlCurrentCharRecover((xmlParserCtxtPtr)buf_local,&l);
        if (cur != 0) {
          if (cur < 0x100) {
            if (((cur < 9) || (10 < cur)) && ((cur != 0xd && (cur < 0x20)))) {
LAB_00140faa:
              xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                                "xmlParseComment: invalid xmlChar value %d\n",cur);
              (*xmlFree)((void *)len_local);
              return;
            }
          }
          else if ((((cur < 0x100) || (0xd7ff < cur)) && ((cur < 0xe000 || (0xfffd < cur)))) &&
                  ((cur < 0x10000 || (0x10ffff < cur)))) goto LAB_00140faa;
          if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
                 *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
                 *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
               *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)l;
          maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf_local,&local_40);
          if (maxLength != 0) {
            do {
              if (maxLength < 0x100) {
                if (((8 < maxLength) && (maxLength < 0xb)) ||
                   ((maxLength == 0xd || (bVar3 = false, 0x1f < maxLength)))) {
LAB_001410c9:
                  bVar3 = true;
                  if ((maxLength == 0x3e) && (bVar3 = true, cur == 0x2d)) {
                    bVar3 = r != 0x2d;
                  }
                }
              }
              else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
                       ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
                      ((bVar3 = false, 0xffff < maxLength && (bVar3 = false, maxLength < 0x110000)))
                      ) goto LAB_001410c9;
              if (!bVar3) {
                *(undefined1 *)(len_local + size_local) = 0;
                if (maxLength == 0) {
                  xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                                    "Comment not terminated \n<!--%.50s\n",(xmlChar *)len_local);
                  goto LAB_00141393;
                }
                if (maxLength < 0x100) {
                  if (((maxLength < 9) || (10 < maxLength)) &&
                     ((maxLength != 0xd && (maxLength < 0x20)))) {
LAB_00141328:
                    xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                                      "xmlParseComment: invalid xmlChar value %d\n",maxLength);
                    goto LAB_00141393;
                  }
                }
                else if ((((maxLength < 0x100) || (0xd7ff < maxLength)) &&
                         ((maxLength < 0xe000 || (0xfffd < maxLength)))) &&
                        ((maxLength < 0x10000 || (0x10ffff < maxLength)))) goto LAB_00141328;
                xmlNextChar((xmlParserCtxtPtr)buf_local);
                if (((*(long *)buf_local != 0) && (*(long *)(*(long *)buf_local + 0xa0) != 0)) &&
                   (*(int *)(buf_local + 0x14c) == 0)) {
                  (**(code **)(*(long *)buf_local + 0xa0))(*(undefined8 *)(buf_local + 8),len_local)
                  ;
                }
LAB_00141393:
                (*xmlFree)((void *)len_local);
                return;
              }
              if ((cur == 0x2d) && (r == 0x2d)) {
                xmlFatalErr((xmlParserCtxtPtr)buf_local,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              if (_ql <= size_local + 5) {
                iVar1 = xmlGrowCapacity((int)_ql,1,1,max);
                if (iVar1 < 0) {
                  xmlFatalErrMsgStr((xmlParserCtxtPtr)buf_local,XML_ERR_COMMENT_NOT_FINISHED,
                                    "Comment too big found",(xmlChar *)0x0);
                  (*xmlFree)((void *)len_local);
                  return;
                }
                pvVar2 = (*xmlRealloc)((void *)len_local,(long)iVar1);
                if (pvVar2 == (void *)0x0) {
                  xmlErrMemory((xmlParserCtxtPtr)buf_local);
                  (*xmlFree)((void *)len_local);
                  return;
                }
                _ql = (size_t)iVar1;
                len_local = (size_t)pvVar2;
              }
              if (r < 0x80) {
                *(char *)(len_local + size_local) = (char)r;
                size_local = size_local + 1;
              }
              else {
                iVar1 = xmlCopyCharMultiByte((xmlChar *)(len_local + size_local),r);
                size_local = (long)iVar1 + size_local;
              }
              r = cur;
              rl = l;
              cur = maxLength;
              l = local_40;
              if (**(char **)(*(long *)(buf_local + 0x38) + 0x20) == '\n') {
                *(int *)(*(long *)(buf_local + 0x38) + 0x34) =
                     *(int *)(*(long *)(buf_local + 0x38) + 0x34) + 1;
                *(undefined4 *)(*(long *)(buf_local + 0x38) + 0x38) = 1;
              }
              else {
                *(int *)(*(long *)(buf_local + 0x38) + 0x38) =
                     *(int *)(*(long *)(buf_local + 0x38) + 0x38) + 1;
              }
              *(long *)(*(long *)(buf_local + 0x38) + 0x20) =
                   *(long *)(*(long *)(buf_local + 0x38) + 0x20) + (long)local_40;
              maxLength = xmlCurrentCharRecover((xmlParserCtxtPtr)buf_local,&local_40);
            } while( true );
          }
          maxLength = 0;
        }
        goto LAB_001413a5;
      }
    }
    else if ((((0xff < r) && (r < 0xd800)) || ((0xdfff < r && (r < 0xfffe)))) ||
            ((0xffff < r && (r < 0x110000)))) goto LAB_00140ecb;
    xmlFatalErrMsgInt((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                      "xmlParseComment: invalid xmlChar value %d\n",r);
    (*xmlFree)((void *)len_local);
  }
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return;
	}
    }
    q = xmlCurrentCharRecover(ctxt, &ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = xmlCurrentCharRecover(ctxt, &rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  r);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

	    newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                             "Comment too big found", NULL);
                xmlFree (buf);
                return;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
		xmlFree(buf);
		return;
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, q);

	q = r;
	ql = rl;
	r = cur;
	rl = l;

	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);

    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
}